

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O0

bool __thiscall pg::SSISolver::si_val_less(SSISolver *this,int a,int b)

{
  int local_50;
  int local_4c;
  int b_i;
  int a_i;
  int i;
  int *b_val;
  int *a_val;
  int b_local;
  int a_local;
  SSISolver *this_local;
  
  if (a == b) {
    this_local._7_1_ = false;
  }
  else {
    b_i = this->k;
    do {
      b_i = b_i + -1;
      if (b_i < 0) {
        return false;
      }
      if (a == -1) {
        local_4c = 0;
      }
      else {
        local_4c = this->val[(long)(this->k * a) + (long)b_i];
      }
      if (b == -1) {
        local_50 = 0;
      }
      else {
        local_50 = this->val[(long)(this->k * b) + (long)b_i];
      }
    } while (local_4c == local_50);
    if ((b_i & 1U) == 0) {
      this_local._7_1_ = local_4c < local_50;
    }
    else {
      this_local._7_1_ = local_50 < local_4c;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
SSISolver::si_val_less(int a, int b)
{
    // if a == b, then of course return false
    if (a == b) return false;
    const int *a_val = val + k*a;
    const int *b_val = val + k*b;
    // find highest priority where they differ
    for (int i=k-1; i>=0; i--) {
        const int a_i = a == -1 ? 0 : a_val[i];
        const int b_i = b == -1 ? 0 : b_val[i];
        if (a_i == b_i) continue;
        if (i&1) return a_i > b_i; // for odd priorities
        else return a_i < b_i;     // for even priorities
    }
    // equal
    return false;
}